

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmCTestHG::LogParser::SplitCData_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,LogParser *this)

{
  size_type sVar1;
  reference pvVar2;
  uint local_44;
  undefined1 local_40 [4];
  uint i;
  string currPath;
  LogParser *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  currPath.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  local_44 = 0;
  while( true ) {
    sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->CData);
    if (sVar1 <= local_44) break;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,(ulong)local_44);
    if (*pvVar2 == ' ') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
      std::__cxx11::string::operator=((string *)local_40,"");
    }
    else {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,(ulong)local_44);
      std::__cxx11::string::operator+=((string *)local_40,*pvVar2);
    }
    local_44 = local_44 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_40);
  currPath.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((currPath.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> SplitCData()
  {
    std::vector<std::string> output;
    std::string currPath;
    for (unsigned int i = 0; i < this->CData.size(); ++i) {
      if (this->CData[i] != ' ') {
        currPath += this->CData[i];
      } else {
        output.push_back(currPath);
        currPath = "";
      }
    }
    output.push_back(currPath);
    return output;
  }